

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

nhdp_domain * nhdp_domain_add(uint8_t ext)

{
  list_entity **pplVar1;
  list_entity *plVar2;
  int iVar3;
  int local_5c;
  int i;
  nhdp_domain *domain;
  nhdp_domain *pnStack_48;
  uint8_t ext_local;
  
  pnStack_48 = nhdp_domain_get_by_ext(ext);
  if (pnStack_48 == (nhdp_domain *)0x0) {
    if (_domain_counter == 4) {
      if ((log_global_mask[LOG_NHDP] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x44d,(void *)0x0,0,
                 "Maximum number of NHDP domains reached: %d",4);
      }
      pnStack_48 = (nhdp_domain *)0x0;
    }
    else {
      pnStack_48 = (nhdp_domain *)oonf_class_malloc(&_domain_class);
      if (pnStack_48 == (nhdp_domain *)0x0) {
        pnStack_48 = (nhdp_domain *)0x0;
      }
      else {
        pnStack_48->ext = ext;
        iVar3 = (int)_domain_counter;
        _domain_counter = _domain_counter + 1;
        pnStack_48->index = iVar3;
        pnStack_48->metric = &_no_metric;
        pnStack_48->mpr = &_everyone_mprs;
        pnStack_48->mpr->_refcount = pnStack_48->mpr->_refcount + 1;
        pnStack_48->metric->_refcount = pnStack_48->metric->_refcount + 1;
        for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
          pnStack_48->_metric_addrtlvs[local_5c].type = '\a';
          pnStack_48->_metric_addrtlvs[local_5c].exttype = pnStack_48->ext;
          rfc5444_writer_register_addrtlvtype
                    (&_protocol->writer,pnStack_48->_metric_addrtlvs + local_5c,-1);
        }
        plVar2 = &pnStack_48->_node;
        plVar2->next = &_domain_list;
        (pnStack_48->_node).prev = _domain_list.prev;
        pplVar1 = &(_domain_list.prev)->next;
        _domain_list.prev = plVar2;
        *pplVar1 = plVar2;
        oonf_class_event(&_domain_class,pnStack_48,OONF_OBJECT_ADDED);
      }
    }
  }
  return pnStack_48;
}

Assistant:

struct nhdp_domain *
nhdp_domain_add(uint8_t ext) {
  struct nhdp_domain *domain;
  int i;

  domain = nhdp_domain_get_by_ext(ext);
  if (domain) {
    return domain;
  }

  if (_domain_counter == NHDP_MAXIMUM_DOMAINS) {
    OONF_WARN(LOG_NHDP, "Maximum number of NHDP domains reached: %d", NHDP_MAXIMUM_DOMAINS);
    return NULL;
  }

  /* initialize new domain */
  domain = oonf_class_malloc(&_domain_class);
  if (domain == NULL) {
    return NULL;
  }

  domain->ext = ext;
  domain->index = _domain_counter++;
  domain->metric = &_no_metric;
  domain->mpr = &_everyone_mprs;

  domain->mpr->_refcount++;
  domain->metric->_refcount++;

  /* initialize metric TLVs */
  for (i = 0; i < 4; i++) {
    domain->_metric_addrtlvs[i].type = RFC7181_ADDRTLV_LINK_METRIC;
    domain->_metric_addrtlvs[i].exttype = domain->ext;

    rfc5444_writer_register_addrtlvtype(&_protocol->writer, &domain->_metric_addrtlvs[i], -1);
  }

  /* add to domain list */
  list_add_tail(&_domain_list, &domain->_node);

  oonf_class_event(&_domain_class, domain, OONF_OBJECT_ADDED);
  return domain;
}